

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_NodalProjector.cpp
# Opt level: O2

void __thiscall
Hydro::NodalProjector::project
          (NodalProjector *this,Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *a_phi
          ,Real a_rtol,Real a_atol)

{
  pointer pMVar1;
  long lVar2;
  int lev;
  long lVar3;
  
  if ((long)(a_phi->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
            super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(a_phi->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
            super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
            super__Vector_impl_data._M_start >> 3 !=
      ((long)(this->m_phi).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
             super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
             super__Vector_impl_data._M_finish -
      (long)(this->m_phi).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
            super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
            super__Vector_impl_data._M_start) / 0x180) {
    amrex::Assert_host("a_phi.size()==m_phi.size()",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/Projections/hydro_NodalProjector.cpp"
                       ,0x14e,(char *)0x0);
  }
  lVar2 = 0;
  for (lVar3 = 0;
      pMVar1 = (this->m_phi).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
               super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
               super__Vector_impl_data._M_start,
      lVar3 < ((long)(this->m_phi).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                     super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pMVar1) / 0x180; lVar3 = lVar3 + 1) {
    amrex::MultiFab::Copy
              ((MultiFab *)
               ((long)&(pMVar1->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + lVar2),
               (a_phi->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
               super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
               super__Vector_impl_data._M_start[lVar3],0,0,1,
               *(int *)((long)&(pMVar1->super_FabArray<amrex::FArrayBox>).super_FabArrayBase +
                       lVar2 + 0xc0));
    lVar2 = lVar2 + 0x180;
  }
  project(this,a_rtol,a_atol);
  lVar3 = 0;
  for (lVar2 = 0;
      pMVar1 = (this->m_phi).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
               super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
               super__Vector_impl_data._M_start,
      lVar2 < ((long)(this->m_phi).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                     super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pMVar1) / 0x180; lVar2 = lVar2 + 1) {
    amrex::MultiFab::Copy
              ((a_phi->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
               super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
               super__Vector_impl_data._M_start[lVar2],
               (MultiFab *)
               ((long)&(pMVar1->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + lVar3),0,0,1,
               *(int *)((long)&(pMVar1->super_FabArray<amrex::FArrayBox>).super_FabArrayBase +
                       lVar3 + 0xc0));
    lVar3 = lVar3 + 0x180;
  }
  return;
}

Assistant:

void
NodalProjector::project ( const Vector<MultiFab*>& a_phi, Real a_rtol, Real a_atol )
{
    AMREX_ALWAYS_ASSERT(a_phi.size()==m_phi.size());

    for (int lev=0; lev < m_phi.size(); ++lev )
    {
        MultiFab::Copy(m_phi[lev],*a_phi[lev],0,0,1,m_phi[lev].nGrow());
    }

    project(a_rtol, a_atol);

    for (int lev=0; lev < m_phi.size(); ++lev )
    {
        MultiFab::Copy(*a_phi[lev],m_phi[lev],0,0,1,m_phi[lev].nGrow());
    }
}